

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::Option::check_sname(Option *this,string *name)

{
  ptrdiff_t pVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  ::std::__cxx11::string::string
            (&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,&this->snames_);
  pVar1 = detail::find_member((string *)&local_28,&local_40,
                              (this->super_OptionBase<CLI::Option>).ignore_case_,false);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  ::std::__cxx11::string::~string((string *)&local_28);
  return -1 < pVar1;
}

Assistant:

CLI11_NODISCARD bool check_sname(std::string name) const {
        return (detail::find_member(std::move(name), snames_, ignore_case_) >= 0);
    }